

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateKotlinDsl
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  FieldDescriptor *field;
  ImmutableFieldLiteGenerator *pIVar4;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *this_00;
  reference ppOVar5;
  OneofGeneratorInfo *args_1;
  OneofGeneratorInfo *pOVar6;
  string local_88;
  OneofDescriptor *local_68;
  OneofDescriptor *oneof;
  iterator __end3;
  iterator __begin3;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print<>
            (printer,
             "@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n@com.google.protobuf.kotlin.ProtoDslMarker\n"
            );
  pPVar1 = local_18;
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[8],std::__cxx11::string>
            (pPVar1,
             "public class Dsl private constructor(\n  private val _builder: $message$.Builder\n) {\n  public companion object {\n    @kotlin.jvm.JvmSynthetic\n    @kotlin.PublishedApi\n    internal fun _create(builder: $message$.Builder): Dsl = Dsl(builder)\n  }\n\n  @kotlin.jvm.JvmSynthetic\n  @kotlin.PublishedApi\n  internal fun _build(): $message$ = _builder.build()\n"
             ,(char (*) [8])0x7a970a,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(local_18);
  __range3._0_4_ = 0;
  while( true ) {
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar3 <= (int)__range3) break;
    io::Printer::Print<>(local_18,"\n");
    field = Descriptor::field((this->super_MessageGenerator).descriptor_,(int)__range3);
    pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,field);
    (*pIVar4->_vptr_ImmutableFieldLiteGenerator[8])(pIVar4,local_18);
    __range3._0_4_ = (int)__range3 + 1;
  }
  this_00 = &(this->super_MessageGenerator).oneofs_;
  __end3 = std::
           set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
           ::begin(this_00);
  oneof = (OneofDescriptor *)
          std::
          set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
          ::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&__end3,(_Self *)&oneof);
    if (!bVar2) break;
    ppOVar5 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                        (&__end3);
    pPVar1 = local_18;
    local_68 = *ppOVar5;
    args_1 = Context::GetOneofGeneratorInfo(this->context_,local_68);
    pOVar6 = Context::GetOneofGeneratorInfo(this->context_,local_68);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_88,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    io::Printer::
    Print<char[11],std::__cxx11::string,char[23],std::__cxx11::string,char[8],std::__cxx11::string>
              (pPVar1,
               "public val $oneof_name$Case: $message$.$oneof_capitalized_name$Case\n  @JvmName(\"get$oneof_capitalized_name$Case\")\n  get() = _builder.get$oneof_capitalized_name$Case()\n\npublic fun clear$oneof_capitalized_name$() {\n  _builder.clear$oneof_capitalized_name$()\n}\n"
               ,(char (*) [11])0x784886,&args_1->name,(char (*) [23])"oneof_capitalized_name",
               &pOVar6->capitalized_name,(char (*) [8])0x7a970a,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3);
  }
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar3) {
    GenerateKotlinExtensions(this,local_18);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateKotlinDsl(
    io::Printer* printer) const {
  printer->Print(
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "@com.google.protobuf.kotlin.ProtoDslMarker\n");
  printer->Print(
      "public class Dsl private constructor(\n"
      "  private val _builder: $message$.Builder\n"
      ") {\n"
      "  public companion object {\n"
      "    @kotlin.jvm.JvmSynthetic\n"
      "    @kotlin.PublishedApi\n"
      "    internal fun _create(builder: $message$.Builder): Dsl = "
      "Dsl(builder)\n"
      "  }\n"
      "\n"
      "  @kotlin.jvm.JvmSynthetic\n"
      "  @kotlin.PublishedApi\n"
      "  internal fun _build(): $message$ = _builder.build()\n",
      "message", name_resolver_->GetClassName(descriptor_, true));

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateKotlinDslMembers(printer);
  }

  for (auto oneof : oneofs_) {
    printer->Print(
        "public val $oneof_name$Case: $message$.$oneof_capitalized_name$Case\n"
        "  @JvmName(\"get$oneof_capitalized_name$Case\")\n"
        "  get() = _builder.get$oneof_capitalized_name$Case()\n\n"
        "public fun clear$oneof_capitalized_name$() {\n"
        "  _builder.clear$oneof_capitalized_name$()\n"
        "}\n",
        "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name,
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "message",
        name_resolver_->GetClassName(descriptor_, true));
  }

  if (descriptor_->extension_range_count() > 0) {
    GenerateKotlinExtensions(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
}